

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_fs_open(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_3c8;
  char *local_3c0;
  undefined1 local_3b8 [8];
  uv_stdio_container_t stdio [1];
  undefined1 local_3a0 [8];
  uv_buf_t buf;
  uv_write_t write_req;
  uv_pipe_t in;
  uv_fs_t fs_req;
  int fd;
  
  fs_req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&in.pipe_fname,"/dev/null",2,0,(uv_fs_cb)0x0);
  if (fs_req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x627,"fd >= 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&in.pipe_fname);
  init_process_options("spawn_helper8",exit_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&write_req.bufsml[3].len,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x62c,"0 == uv_pipe_init(uv_default_loop(), &in, 0)");
    abort();
  }
  options.stdio = (uv_stdio_container_t *)local_3b8;
  local_3b8._0_4_ = UV_READABLE_PIPE|UV_CREATE_PIPE;
  stdio[0]._0_8_ = &write_req.bufsml[3].len;
  options.stdio_count = 1;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x633,"0 == uv_spawn(uv_default_loop(), &process, &options)");
    abort();
  }
  uVar3 = uv_buf_init((char *)((long)&fs_req.bufsml[3].len + 4),4);
  local_3c8 = uVar3.base;
  local_3a0 = (undefined1  [8])local_3c8;
  local_3c0 = (char *)uVar3.len;
  buf.base = local_3c0;
  iVar1 = uv_write((uv_write_t *)&buf.len,(uv_stream_t *)&write_req.bufsml[3].len,
                   (uv_buf_t *)local_3a0,1,write_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x636,"0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x638,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&in.pipe_fname,fs_req.bufsml[3].len._4_4_,
                      (uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x639,"0 == uv_fs_close(NULL, &fs_req, fd, NULL)");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x63b,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x63c,"close_cb_called == 2");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x63e,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];

  fd = uv_fs_open(NULL, &fs_req, "/dev/null", O_RDWR, 0, NULL);
  ASSERT(fd >= 0);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, fd, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}